

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O1

string * __thiscall
deqp::gls::(anonymous_namespace)::generateTestName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,AttribType *type,int arraySize
          )

{
  long lVar1;
  long *plVar2;
  undefined4 in_register_0000000c;
  long *plVar3;
  size_type *psVar4;
  int iVar5;
  long *local_1e0;
  long local_1d8;
  long local_1d0;
  long lStack_1c8;
  long *local_1c0 [2];
  long local_1b0 [2];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  iVar5 = (int)type;
  if (iVar5 == -1) {
    local_1e0 = &local_1d0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e0,0x1b32ab9,0x1b32ab9,CONCAT44(in_register_0000000c,arraySize));
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::ostream::operator<<(local_1a0,iVar5);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    std::ios_base::~ios_base(local_130);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_1c0,0,(char *)0x0,0x1c34848);
    local_1e0 = &local_1d0;
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_1d0 = *plVar3;
      lStack_1c8 = plVar2[3];
    }
    else {
      local_1d0 = *plVar3;
      local_1e0 = (long *)*plVar2;
    }
    local_1d8 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
  }
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_1e0,0,(char *)0x0,*(ulong *)this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,local_1d0 + 1);
  }
  if ((iVar5 != -1) && (local_1c0[0] != local_1b0)) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string generateTestName (const AttribType& type, int arraySize)
{
	return type.getName() + (arraySize != Attribute::NOT_ARRAY ? "_array_" + de::toString(arraySize) : "");
}